

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImU32 ImGui::ColorConvertFloat4ToU32(ImVec4 *in)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar8 [16];
  
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)in->x));
  uVar4 = vcmpss_avx512f(ZEXT416((uint)in->x),ZEXT816(0) << 0x40,1);
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)in->y));
  auVar5._4_12_ = auVar7._4_12_;
  auVar5._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar7._0_4_;
  uVar4 = vcmpss_avx512f(ZEXT416((uint)in->y),ZEXT816(0) << 0x40,1);
  auVar5 = vfmadd213ss_fma(auVar5,SUB6416(ZEXT464(0x437f0000),0),SUB6416(ZEXT464(0x3f000000),0));
  auVar6._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar6._0_4_;
  auVar6 = vfmadd213ss_fma(auVar6,SUB6416(ZEXT464(0x437f0000),0),SUB6416(ZEXT464(0x3f000000),0));
  uVar1 = in->z;
  uVar2 = in->w;
  auVar9._4_4_ = uVar2;
  auVar9._0_4_ = uVar1;
  auVar9._8_8_ = 0;
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  auVar11._8_4_ = 0x437f0000;
  auVar11._0_8_ = 0x437f0000437f0000;
  auVar11._12_4_ = 0x437f0000;
  uVar3 = vcmpps_avx512vl(auVar9,ZEXT816(0),5);
  auVar7 = vminps_avx512vl(auVar12,auVar9);
  auVar8._4_4_ = (uint)((byte)(uVar3 >> 1) & 1) * auVar7._4_4_;
  auVar8._0_4_ = (uint)((byte)uVar3 & 1) * auVar7._0_4_;
  auVar8._8_4_ = (uint)((byte)(uVar3 >> 2) & 1) * auVar7._8_4_;
  auVar8._12_4_ = (uint)((byte)(uVar3 >> 3) & 1) * auVar7._12_4_;
  auVar7._8_4_ = 0x3f000000;
  auVar7._0_8_ = 0x3f0000003f000000;
  auVar7._12_4_ = 0x3f000000;
  auVar7 = vfmadd213ps_avx512vl(auVar11,auVar8,auVar7);
  auVar10._0_4_ = (int)auVar7._0_4_;
  auVar10._4_4_ = (int)auVar7._4_4_;
  auVar10._8_4_ = (int)auVar7._8_4_;
  auVar10._12_4_ = (int)auVar7._12_4_;
  auVar7 = vpsllvd_avx2(auVar10,_DAT_0042cf40);
  return auVar7._4_4_ | auVar7._0_4_ | (int)auVar6._0_4_ << 8 | (int)auVar5._0_4_;
}

Assistant:

ImU32 ImGui::ColorConvertFloat4ToU32(const ImVec4& in)
{
    ImU32 out;
    out  = ((ImU32)IM_F32_TO_INT8_SAT(in.x)) << IM_COL32_R_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.y)) << IM_COL32_G_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.z)) << IM_COL32_B_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.w)) << IM_COL32_A_SHIFT;
    return out;
}